

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Scope *args_2,LookupLocation *args_3,ExpressionSyntax *args_4)

{
  string_view name;
  LookupLocation lookupLocation;
  AttributeSymbol *pAVar1;
  Scope *in_RCX;
  undefined8 *in_RDX;
  SourceLocation *in_RSI;
  undefined8 *in_R8;
  char *in_R9;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pAVar1 = (AttributeSymbol *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  name._M_str = in_R9;
  name._M_len = (size_t)in_RSI[1];
  lookupLocation._8_8_ = in_RDX;
  lookupLocation.scope = in_RCX;
  ast::AttributeSymbol::AttributeSymbol
            ((AttributeSymbol *)*in_RDX,name,*in_RSI,(Scope *)in_R8[1],lookupLocation,
             (ExpressionSyntax *)*in_R8);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }